

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_tri_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  REF_DBL area;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_d0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  *allowed = 0;
  if (-1 < node1) {
    ref_cell = ref_grid->cell[3];
    pRVar1 = ref_cell->ref_adj;
    if ((node1 < pRVar1->nnode) && (lVar6 = (long)pRVar1->first[(uint)node1], lVar6 != -1)) {
      uVar4 = ref_cell_nodes(ref_cell,pRVar1->item[lVar6].ref,local_a8);
      do {
        if (uVar4 != 0) {
          pcVar9 = "nodes";
          uVar8 = 0x324;
LAB_00165f3b:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,uVar8,"ref_collapse_edge_tri_quality",(ulong)uVar4,pcVar9);
          return uVar4;
        }
        uVar5 = (ulong)ref_cell->node_per;
        if ((long)uVar5 < 1) {
LAB_00165fa3:
          uVar4 = ref_node_tri_quality(ref_node,local_a8,&local_b0);
          if (uVar4 != 0) {
            pcVar9 = "qual";
            uVar8 = 0x330;
            goto LAB_00165f3b;
          }
          if (local_b0 < ref_grid->adapt->collapse_quality_absolute) {
            return 0;
          }
          uVar4 = ref_node_tri_area(ref_node,local_a8,&local_b8);
          if (uVar4 != 0) {
            pcVar9 = "vol";
            uVar8 = 0x335;
            goto LAB_00165f3b;
          }
          if (local_b8 <= ref_node->min_volume) {
            return 0;
          }
        }
        else {
          uVar7 = 0;
          bVar3 = false;
          do {
            if (local_a8[uVar7] == node0) {
              bVar3 = true;
            }
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
          if (!bVar3) {
            if (0 < ref_cell->node_per) {
              uVar7 = 0;
              do {
                if (local_a8[uVar7] == node1) {
                  local_a8[uVar7] = node0;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar5);
            }
            goto LAB_00165fa3;
          }
        }
        pRVar2 = ref_cell->ref_adj->item;
        local_d0 = (int)lVar6;
        lVar6 = (long)pRVar2[local_d0].next;
        if (lVar6 == -1) break;
        uVar4 = ref_cell_nodes(ref_cell,pRVar2[lVar6].ref,local_a8);
      } while( true );
    }
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_tri_quality(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL quality, area;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "qual");
    if (quality < ref_grid_adapt(ref_grid, collapse_quality_absolute))
      return REF_SUCCESS;

    /* for twod, should not hurt 3D */
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    if (area <= ref_node_min_volume(ref_node)) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}